

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::ArchiveOUT
          (ChLinkMotorRotationDriveline *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> local_78;
  ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> local_60;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorRotationDriveline>(marchive);
  ChLinkMotorRotation::ArchiveOUT(&this->super_ChLinkMotorRotation,marchive);
  local_30._value = (shared_ptr<chrono::ChShaft> *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_30._name = "innershaft1";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->innershaft2;
  local_48._name = "innershaft2";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->innerconstraint1;
  local_60._name = "innerconstraint1";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->innerconstraint2;
  local_78._name = "innerconstraint2";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorRotationDriveline>();

    // serialize parent class
    ChLinkMotorRotation::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(innershaft1);
    marchive << CHNVP(innershaft2);
    marchive << CHNVP(innerconstraint1);
    marchive << CHNVP(innerconstraint2);
}